

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int type_eq_p(type *type1,type *type2)

{
  arr_type *paVar1;
  arr_type *paVar2;
  byte *pbVar3;
  byte *pbVar4;
  func_type *pfVar5;
  func_type *pfVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  decl_spec *pdVar10;
  decl_spec *pdVar11;
  bool local_79;
  node_t_conflict local_70;
  node_t_conflict p2;
  node_t_conflict p1;
  decl_spec *ds2;
  decl_spec *ds1;
  func_type *ft2;
  func_type *ft1;
  arr_type *at2;
  arr_type *at1;
  expr_conflict *cexpr2;
  expr_conflict *cexpr1;
  type *type2_local;
  type *type1_local;
  
  if (type1->mode == type2->mode) {
    iVar7 = type_qual_eq_p(&type1->type_qual,&type2->type_qual);
    if (iVar7 == 0) {
      type1_local._4_4_ = 0;
    }
    else {
      switch(type1->mode) {
      case TM_BASIC:
        type1_local._4_4_ = (uint)((type1->u).basic_type == (type2->u).basic_type);
        break;
      case TM_ENUM:
      case TM_STRUCT:
      case TM_UNION:
        type1_local._4_4_ = (uint)((type1->u).tag_type == (type2->u).tag_type);
        break;
      case TM_PTR:
        type1_local._4_4_ = type_eq_p((type1->u).ptr_type,(type2->u).ptr_type);
        break;
      case TM_ARR:
        paVar1 = (type1->u).arr_type;
        paVar2 = (type2->u).arr_type;
        local_79 = false;
        if ((*(byte *)paVar1 & 1) == (*(byte *)paVar2 & 1)) {
          iVar7 = type_eq_p(paVar1->el_type,paVar2->el_type);
          local_79 = false;
          if (iVar7 != 0) {
            iVar7 = type_qual_eq_p(&paVar1->ind_type_qual,&paVar2->ind_type_qual);
            local_79 = false;
            if (((iVar7 != 0) && (local_79 = false, paVar1->size->code != N_IGNORE)) &&
               (local_79 = false, paVar2->size->code != N_IGNORE)) {
              pbVar3 = (byte *)paVar1->size->attr;
              local_79 = false;
              if ((*pbVar3 & 1) != 0) {
                pbVar4 = (byte *)paVar2->size->attr;
                local_79 = false;
                if ((*pbVar4 & 1) != 0) {
                  iVar7 = integer_type_p(*(type **)(pbVar4 + 0x18));
                  local_79 = false;
                  if (iVar7 != 0) {
                    iVar7 = integer_type_p(*(type **)(pbVar4 + 0x18));
                    local_79 = false;
                    if (iVar7 != 0) {
                      local_79 = *(long *)(pbVar3 + 0x30) == *(long *)(pbVar4 + 0x30);
                    }
                  }
                }
              }
            }
          }
        }
        type1_local._4_4_ = (uint)local_79;
        break;
      case TM_FUNC:
        pfVar5 = (type1->u).func_type;
        pfVar6 = (type2->u).func_type;
        if (((*(byte *)pfVar5 & 1) == (*(byte *)pfVar6 & 1)) &&
           (iVar7 = type_eq_p(pfVar5->ret_type,pfVar6->ret_type), iVar7 != 0)) {
          sVar8 = DLIST_node_t_length(&(pfVar5->param_list->u).ops);
          sVar9 = DLIST_node_t_length(&(pfVar6->param_list->u).ops);
          if (sVar8 == sVar9) {
            p2 = DLIST_node_t_head(&(pfVar5->param_list->u).ops);
            local_70 = DLIST_node_t_head(&(pfVar6->param_list->u).ops);
            while( true ) {
              if (p2 == (node_t_conflict)0x0) {
                return 1;
              }
              pdVar10 = get_param_decl_spec(p2);
              pdVar11 = get_param_decl_spec(local_70);
              iVar7 = type_eq_p(pdVar10->type,pdVar11->type);
              if (iVar7 == 0) break;
              p2 = DLIST_node_t_next(p2);
              local_70 = DLIST_node_t_next(local_70);
            }
            return 0;
          }
        }
        type1_local._4_4_ = 0;
        break;
      default:
        type1_local._4_4_ = 0;
      }
    }
  }
  else {
    type1_local._4_4_ = 0;
  }
  return type1_local._4_4_;
}

Assistant:

static int type_eq_p (struct type *type1, struct type *type2) {
  if (type1->mode != type2->mode) return FALSE;
  if (!type_qual_eq_p (&type1->type_qual, &type2->type_qual)) return FALSE;
  switch (type1->mode) {
  case TM_BASIC: return type1->u.basic_type == type2->u.basic_type;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: return type1->u.tag_type == type2->u.tag_type;
  case TM_PTR: return type_eq_p (type1->u.ptr_type, type2->u.ptr_type);
  case TM_ARR: {
    struct expr *cexpr1, *cexpr2;
    struct arr_type *at1 = type1->u.arr_type, *at2 = type2->u.arr_type;

    return (at1->static_p == at2->static_p && type_eq_p (at1->el_type, at2->el_type)
            && type_qual_eq_p (&at1->ind_type_qual, &at2->ind_type_qual)
            && at1->size->code != N_IGNORE && at2->size->code != N_IGNORE
            && (cexpr1 = at1->size->attr)->const_p && (cexpr2 = at2->size->attr)->const_p
            && integer_type_p (cexpr2->type) && integer_type_p (cexpr2->type)
            && cexpr1->c.i_val == cexpr2->c.i_val);
  }
  case TM_FUNC: {
    struct func_type *ft1 = type1->u.func_type, *ft2 = type2->u.func_type;
    struct decl_spec *ds1, *ds2;

    if (ft1->dots_p != ft2->dots_p || !type_eq_p (ft1->ret_type, ft2->ret_type)
        || NL_LENGTH (ft1->param_list->u.ops) != NL_LENGTH (ft2->param_list->u.ops))
      return FALSE;
    for (node_t p1 = NL_HEAD (ft1->param_list->u.ops), p2 = NL_HEAD (ft2->param_list->u.ops);
         p1 != NULL; p1 = NL_NEXT (p1), p2 = NL_NEXT (p2)) {
      ds1 = get_param_decl_spec (p1);
      ds2 = get_param_decl_spec (p2);
      if (!type_eq_p (ds1->type, ds2->type)) return FALSE;
      // ??? other qualifiers
    }
    return TRUE;
  }
  default: return FALSE;
  }
}